

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,SourceLineInfo *info)

{
  ostream *poVar1;
  SourceLineInfo *info_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,info->file);
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::operator<<(poVar1,info->line);
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, SourceLineInfo const& info ) {
#ifndef __GNUG__
        os << info.file << '(' << info.line << ')';
#else
        os << info.file << ':' << info.line;
#endif
        return os;
    }